

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_functions.cpp
# Opt level: O2

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::ArrayGenericBinaryBind
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  reference pvVar4;
  pointer pEVar5;
  pointer pEVar6;
  reference pvVar7;
  idx_t index;
  idx_t iVar8;
  LogicalType *pLVar9;
  LogicalType *right;
  InvalidInputException *this_00;
  ParameterNotResolvedException *this_01;
  BinderException *pBVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params;
  vector<duckdb::LogicalType,_true> *this_02;
  allocator local_171;
  ScalarFunction *local_170;
  string local_168;
  LogicalType common_type;
  optional_idx local_120;
  optional_idx local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50 [32];
  
  pvVar4 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::get<true>(arguments,0);
  pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar4);
  iVar3 = (*(pEVar5->super_BaseExpression)._vptr_BaseExpression[6])(pEVar5);
  pvVar4 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::get<true>(arguments,1);
  pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar4);
  params = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (pEVar5->super_BaseExpression)._vptr_BaseExpression;
  bVar1 = (*(code *)params[1].field_2._M_allocated_capacity)(pEVar5);
  if (((byte)iVar3 & bVar1) == 1) {
    this_01 = (ParameterNotResolvedException *)__cxa_allocate_exception(0x10);
    ParameterNotResolvedException::ParameterNotResolvedException(this_01);
    __cxa_throw(this_01,&ParameterNotResolvedException::typeinfo,
                ::std::runtime_error::~runtime_error);
  }
  pvVar4 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::get<true>(arguments,0);
  pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar4);
  pvVar4 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::get<true>(arguments,1);
  pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar4);
  pLVar9 = &pEVar5->return_type;
  if ((byte)iVar3 != 0) {
    pLVar9 = &pEVar6->return_type;
  }
  this_02 = &(bound_function->super_BaseScalarFunction).super_SimpleFunction.arguments;
  local_170 = bound_function;
  pvVar7 = vector<duckdb::LogicalType,_true>::get<true>(this_02,0);
  LogicalType::operator=(pvVar7,pLVar9);
  pLVar9 = &pEVar6->return_type;
  if (bVar1 != 0) {
    pLVar9 = &pEVar5->return_type;
  }
  pvVar7 = vector<duckdb::LogicalType,_true>::get<true>(this_02,1);
  LogicalType::operator=(pvVar7,pLVar9);
  pvVar7 = vector<duckdb::LogicalType,_true>::get<true>(this_02,0);
  if (pvVar7->id_ == ARRAY) {
    pvVar7 = vector<duckdb::LogicalType,_true>::get<true>(this_02,1);
    if (pvVar7->id_ == ARRAY) {
      pvVar7 = vector<duckdb::LogicalType,_true>::get<true>(this_02,0);
      index = ArrayType::GetSize(pvVar7);
      pvVar7 = vector<duckdb::LogicalType,_true>::get<true>(this_02,1);
      iVar8 = ArrayType::GetSize(pvVar7);
      if (index != iVar8) {
        pBVar10 = (BinderException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_168,"%s: Array arguments must be of the same size",
                   (allocator *)&common_type);
        ::std::__cxx11::string::string
                  ((string *)&local_90,
                   (string *)
                   &(local_170->super_BaseScalarFunction).super_SimpleFunction.super_Function.name);
        BinderException::BinderException<std::__cxx11::string>(pBVar10,&local_168,&local_90);
        __cxa_throw(pBVar10,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pvVar7 = vector<duckdb::LogicalType,_true>::get<true>(this_02,0);
      pLVar9 = ArrayType::GetChildType(pvVar7);
      pvVar7 = vector<duckdb::LogicalType,_true>::get<true>(this_02,1);
      right = ArrayType::GetChildType(pvVar7);
      LogicalType::LogicalType(&common_type);
      bVar2 = LogicalType::TryGetMaxLogicalType(context,pLVar9,right,&common_type);
      if (bVar2) {
        if ((common_type.id_ & ~SQLNULL) == FLOAT) {
          optional_idx::optional_idx(&local_118,index);
          LogicalType::ARRAY((LogicalType *)&local_168,&common_type,local_118);
          pvVar7 = vector<duckdb::LogicalType,_true>::get<true>(this_02,0);
          LogicalType::operator=(pvVar7,(LogicalType *)&local_168);
          LogicalType::~LogicalType((LogicalType *)&local_168);
          optional_idx::optional_idx(&local_120,index);
          LogicalType::ARRAY((LogicalType *)&local_168,&common_type,local_120);
          pvVar7 = vector<duckdb::LogicalType,_true>::get<true>(this_02,1);
          LogicalType::operator=(pvVar7,(LogicalType *)&local_168);
          LogicalType::~LogicalType((LogicalType *)&local_168);
          *(undefined8 *)this = 0;
          LogicalType::~LogicalType(&common_type);
          return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
                 (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
        }
        pBVar10 = (BinderException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_168,"%s: Arguments must be arrays of FLOAT or DOUBLE",&local_171
                  );
        ::std::__cxx11::string::string
                  ((string *)&local_110,
                   (string *)
                   &(local_170->super_BaseScalarFunction).super_SimpleFunction.super_Function.name);
        BinderException::BinderException<std::__cxx11::string>(pBVar10,&local_168,&local_110);
        __cxa_throw(pBVar10,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pBVar10 = (BinderException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_168,
                 "%s: Cannot infer common element type (left = \'%s\', right = \'%s\')",&local_171);
      ::std::__cxx11::string::string
                ((string *)&local_b0,
                 (string *)
                 &(local_170->super_BaseScalarFunction).super_SimpleFunction.super_Function.name);
      LogicalType::ToString_abi_cxx11_(&local_d0,pLVar9);
      LogicalType::ToString_abi_cxx11_(&local_f0,right);
      BinderException::
      BinderException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                (pBVar10,&local_168,&local_b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f0);
      __cxa_throw(pBVar10,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            (local_50,"%s: Arguments must be arrays of FLOAT or DOUBLE",(allocator *)&common_type);
  ::std::__cxx11::string::string
            ((string *)&local_70,
             (string *)
             &(local_170->super_BaseScalarFunction).super_SimpleFunction.super_Function.name);
  StringUtil::Format<std::__cxx11::string>(&local_168,(StringUtil *)local_50,&local_70,params);
  InvalidInputException::InvalidInputException(this_00,(string *)&local_168);
  __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static unique_ptr<FunctionData> ArrayGenericBinaryBind(ClientContext &context, ScalarFunction &bound_function,
                                                       vector<unique_ptr<Expression>> &arguments) {

	const auto lhs_is_param = arguments[0]->HasParameter();
	const auto rhs_is_param = arguments[1]->HasParameter();

	if (lhs_is_param && rhs_is_param) {
		throw ParameterNotResolvedException();
	}

	const auto &lhs_type = arguments[0]->return_type;
	const auto &rhs_type = arguments[1]->return_type;

	bound_function.arguments[0] = lhs_is_param ? rhs_type : lhs_type;
	bound_function.arguments[1] = rhs_is_param ? lhs_type : rhs_type;

	if (bound_function.arguments[0].id() != LogicalTypeId::ARRAY ||
	    bound_function.arguments[1].id() != LogicalTypeId::ARRAY) {
		throw InvalidInputException(
		    StringUtil::Format("%s: Arguments must be arrays of FLOAT or DOUBLE", bound_function.name));
	}

	const auto lhs_size = ArrayType::GetSize(bound_function.arguments[0]);
	const auto rhs_size = ArrayType::GetSize(bound_function.arguments[1]);

	if (lhs_size != rhs_size) {
		throw BinderException("%s: Array arguments must be of the same size", bound_function.name);
	}

	const auto &lhs_element_type = ArrayType::GetChildType(bound_function.arguments[0]);
	const auto &rhs_element_type = ArrayType::GetChildType(bound_function.arguments[1]);

	// Resolve common type
	LogicalType common_type;
	if (!LogicalType::TryGetMaxLogicalType(context, lhs_element_type, rhs_element_type, common_type)) {
		throw BinderException("%s: Cannot infer common element type (left = '%s', right = '%s')", bound_function.name,
		                      lhs_element_type.ToString(), rhs_element_type.ToString());
	}

	// Ensure it is float or double
	if (common_type.id() != LogicalTypeId::FLOAT && common_type.id() != LogicalTypeId::DOUBLE) {
		throw BinderException("%s: Arguments must be arrays of FLOAT or DOUBLE", bound_function.name);
	}

	// The important part is just that we resolve the size of the input arrays
	bound_function.arguments[0] = LogicalType::ARRAY(common_type, lhs_size);
	bound_function.arguments[1] = LogicalType::ARRAY(common_type, rhs_size);

	return nullptr;
}